

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddConfigVariableFlags
          (cmLocalGenerator *this,string *flags,string *var,string *config)

{
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string flagsVar;
  string local_e8;
  string local_c8;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined1 local_90 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  size_type local_40;
  pointer local_38;
  string *local_30;
  
  psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,var);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,psVar1);
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_c8,config);
    local_70.first._M_str = (var->_M_dataplus)._M_p;
    local_70.first._M_len = var->_M_string_length;
    local_70.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98 = local_90;
    local_a8 = 0;
    local_a0 = 1;
    local_90[0] = 0x5f;
    local_58 = 1;
    local_48 = 0;
    local_40 = local_c8._M_string_length;
    local_38 = local_c8._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_70;
    local_50 = local_98;
    local_30 = &local_c8;
    cmCatViews(&local_e8,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,&local_e8);
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,psVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AddConfigVariableFlags(std::string& flags,
                                              const std::string& var,
                                              const std::string& config)
{
  // Add the flags from the variable itself.
  this->AppendFlags(flags, this->Makefile->GetSafeDefinition(var));
  // Add the flags from the build-type specific variable.
  if (!config.empty()) {
    const std::string flagsVar =
      cmStrCat(var, '_', cmSystemTools::UpperCase(config));
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(flagsVar));
  }
}